

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

void __thiscall
GlobOpt::SetLoopFieldInitialValue
          (GlobOpt *this,Loop *loop,Instr *instr,PropertySym *propertySym,
          PropertySym *originalPropertySym)

{
  Opnd *this_00;
  JitArenaAllocator *alloc;
  code *pcVar1;
  BOOLEAN BVar2;
  bool bVar3;
  uint sourceContextId;
  uint functionId;
  Value *pVVar4;
  undefined4 *puVar5;
  ProfiledInstr *pPVar6;
  SymOpnd *pSVar7;
  RegOpnd *pRVar8;
  StackSym *pSVar9;
  Instr *pIVar10;
  ValueType *pVVar11;
  ValueInfo *valueInfo;
  BasicBlock *pBVar12;
  BasicBlock *pBVar13;
  Value *local_60;
  Value *local_58;
  StackSym *local_50;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_42;
  PropertySym *pPStack_40;
  ValueType profiledValueType;
  PropertySym *propertySym_local;
  Value *initialValue;
  
  propertySym_local = (PropertySym *)0x0;
  if ((loop->field_0x178 & 0x80) == 0) {
    pPStack_40 = propertySym;
    BVar2 = BVSparse<Memory::JitArenaAllocator>::Test
                      (loop->fieldKilled,(originalPropertySym->super_Sym).m_id);
    if (BVar2 != '\0') {
      return;
    }
    BVar2 = BVSparse<Memory::JitArenaAllocator>::Test
                      (loop->fieldKilled,(propertySym->super_Sym).m_id);
    if (BVar2 != '\0') {
      return;
    }
    pVVar4 = GlobOptBlockData::FindValue(&this->currentBlock->globOptData,&propertySym->super_Sym);
    if (pVVar4 != (Value *)0x0) {
      return;
    }
    bVar3 = JsUtil::
            BaseDictionary<PropertySym*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::TryGetValue<PropertySym*>
                      ((BaseDictionary<PropertySym*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        *)&loop->initialValueFieldMap,&stack0xffffffffffffffc0,
                       (Value **)&propertySym_local);
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0xc98,
                         "(!loop->initialValueFieldMap.TryGetValue(propertySym, &initialValue))",
                         "!loop->initialValueFieldMap.TryGetValue(propertySym, &initialValue)");
      if (!bVar3) goto LAB_0042ad97;
      *puVar5 = 0;
    }
    local_50 = (StackSym *)&loop->initialValueFieldMap;
    BVar2 = BVSparse<Memory::JitArenaAllocator>::Test
                      ((loop->landingPad->globOptData).liveFields,(pPStack_40->super_Sym).m_id);
    if (BVar2 == '\0') {
      pSVar9 = pPStack_40->m_stackSym;
      local_58 = GlobOptBlockData::FindValue(&loop->landingPad->globOptData,&pSVar9->super_Sym);
      pVVar4 = GlobOptBlockData::FindValue(&this->currentBlock->globOptData,&pSVar9->super_Sym);
      if (pVVar4 != (Value *)0x0) {
        if (local_58 == (Value *)0x0) {
          pIVar10 = (pSVar9->field_5).m_instrDef;
          if ((pIVar10 != (Instr *)0x0 & pSVar9->field_0x18) == 1) {
            while (this_00 = pIVar10->m_src1, this_00 != (Opnd *)0x0) {
              bVar3 = IR::Opnd::IsSymOpnd(this_00);
              if ((bVar3) &&
                 (pSVar7 = IR::Opnd::AsSymOpnd(this_00), pSVar7->m_sym->m_kind == SymKindProperty))
              goto LAB_0042aa32;
              bVar3 = IR::Opnd::IsRegOpnd(this_00);
              if (!bVar3) {
                return;
              }
              pRVar8 = IR::Opnd::AsRegOpnd(this_00);
              pSVar9 = IR::Opnd::GetStackSym(&pRVar8->super_Opnd);
              if ((pSVar9->field_0x18 & 1) == 0) {
                return;
              }
              if ((pSVar9->field_5).m_instrDef == (Instr *)0x0) {
                return;
              }
              pRVar8 = IR::Opnd::AsRegOpnd(this_00);
              pSVar9 = IR::Opnd::GetStackSym(&pRVar8->super_Opnd);
              if ((pSVar9->field_0x18 & 1) == 0) {
                pIVar10 = (Instr *)0x0;
              }
              else {
                pIVar10 = (pSVar9->field_5).m_instrDef;
              }
            }
          }
        }
        else if (pVVar4->valueNumber == local_58->valueNumber) {
LAB_0042aa32:
          if (instr->m_kind == InstrKindProfiled) {
            pPVar6 = IR::Instr::AsProfiledInstr(instr);
            pVVar11 = (ValueType *)&pPVar6->u;
          }
          else {
            pVVar11 = &ValueType::Uninitialized;
          }
          pSVar9 = local_50;
          local_42 = (anon_union_2_4_ea848c7b_for_ValueType_13)pVVar11->field_0;
          bVar3 = ValueType::IsDefinite((ValueType *)&local_42.field_0);
          if (bVar3) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar5 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0xcd5,"(!profiledValueType.IsDefinite())",
                               "!profiledValueType.IsDefinite()");
            if (!bVar3) {
LAB_0042ad97:
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *puVar5 = 0;
          }
          propertySym_local =
               (PropertySym *)
               NewGenericValue(this,(ValueType)local_42.field_0,&pPStack_40->super_Sym);
          local_50 = StackSym::New(this->func);
          ValueInfo::SetSymStore
                    ((ValueInfo *)(propertySym_local->super_Sym).m_next,&local_50->super_Sym);
          local_60 = ::Value::Copy((Value *)propertySym_local,this->alloc,
                                   *(ValueNumber *)&(propertySym_local->super_Sym)._vptr_Sym);
          JsUtil::
          BaseDictionary<PropertySym*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::
          Insert<(JsUtil::BaseDictionary<PropertySym*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                    ((BaseDictionary<PropertySym*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)pSVar9,&stack0xffffffffffffffc0,&local_60);
          alloc = this->alloc;
          local_58 = (Value *)CONCAT44(local_58._4_4_,
                                       *(undefined4 *)&(propertySym_local->super_Sym)._vptr_Sym);
          valueInfo = ValueInfo::New(alloc,(ValueType)
                                           *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                                            &((propertySym_local->super_Sym).m_next)->m_next);
          pVVar4 = ::Value::New(alloc,(ValueNumber)local_58,valueInfo);
          GlobOptBlockData::SetValue(&loop->landingPad->globOptData,pVVar4,&pPStack_40->super_Sym);
          BVSparse<Memory::JitArenaAllocator>::Set
                    ((loop->landingPad->globOptData).liveFields,(pPStack_40->super_Sym).m_id);
          sourceContextId = Func::GetSourceContextId(this->func);
          functionId = Func::GetLocalFunctionId(this->func);
          bVar3 = Js::Phases::IsEnabled
                            ((Phases *)&DAT_01453738,FieldPREPhase,sourceContextId,functionId);
          if (bVar3) {
            pBVar12 = Loop::GetHeadBlock(loop);
            Output::Print(L"** TRACE:  Field PRE initial value for loop head #%d. Val:%d symStore:",
                          (ulong)pBVar12->number,
                          (ulong)*(uint *)&(propertySym_local->super_Sym)._vptr_Sym);
            Sym::Dump(&local_50->super_Sym,(ValueType)0x9);
            Output::Print(L"\n    Instr: ");
            IR::Instr::Dump(instr);
            Output::Flush();
          }
          pBVar12 = Loop::GetHeadBlock(loop);
          if (pBVar12 == (BasicBlock *)0x0) {
            pBVar12 = (BasicBlock *)0x0;
          }
          else {
            pBVar12 = Loop::GetHeadBlock(loop);
            pBVar12 = pBVar12->prev;
          }
          for (pBVar13 = BasicBlock::GetPrev(this->currentBlock); pSVar9 = local_50,
              pBVar13 != pBVar12; pBVar13 = pBVar13->prev) {
            if (((pBVar13->field_0x18 & 1) == 0) && (pBVar13->dataUseCount != 0)) {
              pVVar4 = ::Value::Copy((Value *)propertySym_local,this->alloc,
                                     *(ValueNumber *)&(propertySym_local->super_Sym)._vptr_Sym);
              GlobOptBlockData::SetValue(&pBVar13->globOptData,pVVar4,&pPStack_40->super_Sym);
              BVSparse<Memory::JitArenaAllocator>::Set
                        ((pBVar13->globOptData).liveFields,(pPStack_40->super_Sym).m_id);
              pSVar9 = local_50;
              GlobOptBlockData::SetValue(&pBVar13->globOptData,pVVar4,&local_50->super_Sym);
              BVSparse<Memory::JitArenaAllocator>::Set
                        ((pBVar13->globOptData).liveVarSyms,(pSVar9->super_Sym).m_id);
            }
          }
          GlobOptBlockData::SetValue
                    (&this->currentBlock->globOptData,(Value *)propertySym_local,
                     &local_50->super_Sym);
          BVSparse<Memory::JitArenaAllocator>::Set
                    ((this->currentBlock->globOptData).liveVarSyms,(pSVar9->super_Sym).m_id);
          BVSparse<Memory::JitArenaAllocator>::Set
                    ((this->currentBlock->globOptData).liveFields,(pPStack_40->super_Sym).m_id);
        }
      }
    }
  }
  return;
}

Assistant:

void
GlobOpt::SetLoopFieldInitialValue(Loop *loop, IR::Instr *instr, PropertySym *propertySym, PropertySym *originalPropertySym)
{
    Value *initialValue = nullptr;
    StackSym *symStore;

    if (loop->allFieldsKilled || loop->fieldKilled->Test(originalPropertySym->m_id) || loop->fieldKilled->Test(propertySym->m_id))
    {
        return;
    }

    // Value already exists
    if (CurrentBlockData()->FindValue(propertySym))
    {
        return;
    }

    // If this initial value was already added, we would find in the current value table.
    Assert(!loop->initialValueFieldMap.TryGetValue(propertySym, &initialValue));

    // If propertySym is live in landingPad, we don't need an initial value.
    if (loop->landingPad->globOptData.liveFields->Test(propertySym->m_id))
    {
        return;
    }

    StackSym * objectSym = propertySym->m_stackSym;
    Value *landingPadObjPtrVal, *currentObjPtrVal;
    landingPadObjPtrVal = loop->landingPad->globOptData.FindValue(objectSym);
    currentObjPtrVal = CurrentBlockData()->FindValue(objectSym);
    
    auto CanSetInitialValue = [&]() -> bool {
        if (!currentObjPtrVal)
        {
            return false;
        }
        if (landingPadObjPtrVal)
        {
            return currentObjPtrVal->GetValueNumber() == landingPadObjPtrVal->GetValueNumber();
        }
        else
        {
            if (!objectSym->IsSingleDef())
            {
                return false;
            }
            IR::Instr * defInstr = objectSym->GetInstrDef();
            IR::Opnd * src1 = defInstr->GetSrc1();
            while (!(src1 && src1->IsSymOpnd() && src1->AsSymOpnd()->m_sym->IsPropertySym()))
            {
                if (src1 && src1->IsRegOpnd() && src1->AsRegOpnd()->GetStackSym()->IsSingleDef())
                {
                    defInstr = src1->AsRegOpnd()->GetStackSym()->GetInstrDef();
                    src1 = defInstr->GetSrc1();
                }
                else
                {
                    return false;
                }
            }

            return true;

            // Todo: allow other kinds of operands as src1 of instr def of the object sym of the current propertySym
            // SymOpnd, but not PropertySymOpnd - LdSlotArr, some LdSlots (?)
            // nullptr - NewScObject
        }
    };

    if (!CanSetInitialValue())
    {
        // objPtr has a different value in the landing pad.
        return;
    }

    // The opnd's value type has not yet been initialized. Since the property sym doesn't have a value, it effectively has an
    // Uninitialized value type. Use the profiled value type from the instruction.
    const ValueType profiledValueType =
        instr->IsProfiledInstr() ? instr->AsProfiledInstr()->u.FldInfo().valueType : ValueType::Uninitialized;
    Assert(!profiledValueType.IsDefinite()); // Hence the values created here don't need to be tracked for kills
    initialValue = this->NewGenericValue(profiledValueType, propertySym);
    symStore = StackSym::New(this->func);

    initialValue->GetValueInfo()->SetSymStore(symStore);
    loop->initialValueFieldMap.Add(propertySym, initialValue->Copy(this->alloc, initialValue->GetValueNumber()));

    // Copy the initial value into the landing pad, but without a symStore
    Value *landingPadInitialValue = Value::New(this->alloc, initialValue->GetValueNumber(),
        ValueInfo::New(this->alloc, initialValue->GetValueInfo()->Type()));
    loop->landingPad->globOptData.SetValue(landingPadInitialValue, propertySym);
    loop->landingPad->globOptData.liveFields->Set(propertySym->m_id);

#if DBG_DUMP
    if (PHASE_TRACE(Js::FieldPREPhase, this->func))
    {
        Output::Print(_u("** TRACE:  Field PRE initial value for loop head #%d. Val:%d symStore:"),
            loop->GetHeadBlock()->GetBlockNum(), initialValue->GetValueNumber());
        symStore->Dump();
        Output::Print(_u("\n    Instr: "));
        instr->Dump();
        Output::Flush();
    }
#endif

    // Add initial value to all the previous blocks in the loop.
    FOREACH_BLOCK_BACKWARD_IN_RANGE(block, this->currentBlock->GetPrev(), loop->GetHeadBlock())
    {
        if (block->GetDataUseCount() == 0)
        {
            // All successor blocks have been processed, no point in adding the value.
            continue;
        }
        Value *newValue = initialValue->Copy(this->alloc, initialValue->GetValueNumber());
        block->globOptData.SetValue(newValue, propertySym);
        block->globOptData.liveFields->Set(propertySym->m_id);
        block->globOptData.SetValue(newValue, symStore);
        block->globOptData.liveVarSyms->Set(symStore->m_id);
    } NEXT_BLOCK_BACKWARD_IN_RANGE;

    CurrentBlockData()->SetValue(initialValue, symStore);
    CurrentBlockData()->liveVarSyms->Set(symStore->m_id);
    CurrentBlockData()->liveFields->Set(propertySym->m_id);
}